

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void cfd::core::MergePsbtOutputItem
               (wally_psbt_output *psbt,wally_psbt_output *psbt_dest,bool ignore_duplicate_error)

{
  size_t sVar1;
  uint8_t *puVar2;
  size_t sVar3;
  uint8_t *puVar4;
  wally_map *pwVar5;
  wally_map *pwVar6;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  byte local_19;
  wally_psbt_output *pwStack_18;
  bool ignore_duplicate_error_local;
  wally_psbt_output *psbt_dest_local;
  wally_psbt_output *psbt_local;
  
  local_19 = ignore_duplicate_error;
  pwStack_18 = psbt_dest;
  psbt_dest_local = psbt;
  if (psbt_dest->redeem_script_len != 0) {
    if (psbt->redeem_script_len == 0) {
      puVar4 = AllocWallyBuffer(psbt_dest->redeem_script,psbt_dest->redeem_script_len);
      psbt_dest_local->redeem_script = puVar4;
      psbt_dest_local->redeem_script_len = pwStack_18->redeem_script_len;
    }
    else {
      puVar4 = psbt->redeem_script;
      sVar1 = psbt->redeem_script_len;
      puVar2 = psbt_dest->redeem_script;
      sVar3 = psbt_dest->redeem_script_len;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_40,"txout redeem script",&local_41);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_78,"",&local_79);
      ComparePsbtData(puVar4,sVar1,puVar2,sVar3,&local_40,&local_78,(bool)(local_19 & 1));
      ::std::__cxx11::string::~string((string *)&local_78);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
      ::std::__cxx11::string::~string((string *)&local_40);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
  }
  if (pwStack_18->witness_script_len != 0) {
    if (psbt_dest_local->witness_script_len == 0) {
      puVar4 = AllocWallyBuffer(pwStack_18->witness_script,pwStack_18->witness_script_len);
      psbt_dest_local->witness_script = puVar4;
      psbt_dest_local->witness_script_len = pwStack_18->witness_script_len;
    }
    else {
      puVar4 = psbt_dest_local->witness_script;
      sVar1 = psbt_dest_local->witness_script_len;
      puVar2 = pwStack_18->witness_script;
      sVar3 = pwStack_18->witness_script_len;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_a0,"txout witness script",&local_a1);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_c8,"",&local_c9);
      ComparePsbtData(puVar4,sVar1,puVar2,sVar3,&local_a0,&local_c8,(bool)(local_19 & 1));
      ::std::__cxx11::string::~string((string *)&local_c8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      ::std::__cxx11::string::~string((string *)&local_a0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
  }
  pwVar5 = &psbt_dest_local->keypaths;
  pwVar6 = &pwStack_18->keypaths;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_f0,"txout keypaths",&local_f1);
  MergeWallyMap(pwVar5,pwVar6,&local_f0,(bool)(local_19 & 1));
  ::std::__cxx11::string::~string((string *)&local_f0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  pwVar5 = &psbt_dest_local->unknowns;
  pwVar6 = &pwStack_18->unknowns;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_118,"txout unknowns",&local_119);
  MergeWallyMap(pwVar5,pwVar6,&local_118,(bool)(local_19 & 1));
  ::std::__cxx11::string::~string((string *)&local_118);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_119);
  return;
}

Assistant:

void MergePsbtOutputItem(
    struct wally_psbt_output *psbt, const struct wally_psbt_output *psbt_dest,
    bool ignore_duplicate_error) {
  if (psbt_dest->redeem_script_len > 0) {
    if (psbt->redeem_script_len == 0) {
      psbt->redeem_script = AllocWallyBuffer(
          psbt_dest->redeem_script, psbt_dest->redeem_script_len);
      psbt->redeem_script_len = psbt_dest->redeem_script_len;
    } else {
      ComparePsbtData(
          psbt->redeem_script, psbt->redeem_script_len,
          psbt_dest->redeem_script, psbt_dest->redeem_script_len,
          "txout redeem script", "", ignore_duplicate_error);
    }
  }
  if (psbt_dest->witness_script_len > 0) {
    if (psbt->witness_script_len == 0) {
      psbt->witness_script = AllocWallyBuffer(
          psbt_dest->witness_script, psbt_dest->witness_script_len);
      psbt->witness_script_len = psbt_dest->witness_script_len;
    } else {
      ComparePsbtData(
          psbt->witness_script, psbt->witness_script_len,
          psbt_dest->witness_script, psbt_dest->witness_script_len,
          "txout witness script", "", ignore_duplicate_error);
    }
  }
  MergeWallyMap(
      &psbt->keypaths, &psbt_dest->keypaths, "txout keypaths",
      ignore_duplicate_error);
  MergeWallyMap(
      &psbt->unknowns, &psbt_dest->unknowns, "txout unknowns",
      ignore_duplicate_error);
}